

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

bool __thiscall Engine::propagate(Engine *this)

{
  vec<Propagator_*> *pvVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  if (this->async_fail == true) {
    this->async_fail = false;
  }
  else {
    this->last_prop = (Propagator *)0x0;
    do {
      if ((sat.qhead.data[sat.qhead.sz - 1] != sat.trail.data[sat.trail.sz - 1].sz) &&
         (bVar3 = SAT::propagate(&sat), !bVar3)) {
        return false;
      }
      if ((this->v_queue).sz != 0) {
        uVar7 = 0;
        do {
          IntVar::wakePropagators((this->v_queue).data[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar7 < (this->v_queue).sz);
      }
      if ((this->v_queue).data != (IntVar **)0x0) {
        (this->v_queue).sz = 0;
      }
      if (sat.confl != (Clause *)0x0) {
        return false;
      }
      this->last_prop = (Propagator *)0x0;
      pvVar1 = (this->p_queue).data;
      lVar5 = 0;
      do {
        iVar4 = *(int *)((long)&pvVar1->sz + lVar5);
        if (iVar4 != 0) {
          uVar6 = iVar4 - 1;
          plVar2 = *(long **)(*(long *)((long)&pvVar1->data + lVar5) + (ulong)uVar6 * 8);
          *(uint *)((long)&pvVar1->sz + lVar5) = uVar6;
          this->propagations = this->propagations + 1;
          uVar6 = (**(code **)(*plVar2 + 0x18))(plVar2);
          (**(code **)(*plVar2 + 0x20))(plVar2);
          iVar4 = (uVar6 & 0xff) + 1;
          goto LAB_001b934e;
        }
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x60);
      iVar4 = 6;
LAB_001b934e:
    } while (iVar4 == 2);
    if (iVar4 != 1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Engine::propagate() {
	if (async_fail) {
		async_fail = false;
		assert(!so.lazy || sat.confl);
		return false;
	}

	last_prop = nullptr;

WakeUp:

	if (!sat.consistent() && !sat.propagate()) {
		return false;
	}

	for (unsigned int i = 0; i < v_queue.size(); i++) {
		v_queue[i]->wakePropagators();
	}
	v_queue.clear();

	if (sat.confl != nullptr) {
		return false;
	}

	last_prop = nullptr;

	for (int i = 0; i < num_queues; i++) {
		if (p_queue[i].size() != 0) {
			Propagator* p = p_queue[i].last();
			p_queue[i].pop();
			propagations++;
			const bool ok = p->propagate();
			p->clearPropState();
			if (!ok) {
				return false;
			}
			goto WakeUp;
		}
	}

	return true;
}